

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O2

void __thiscall
Rml::FilterBasicInstancer::FilterBasicInstancer
          (FilterBasicInstancer *this,ValueType value_type,char *default_value)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  String local_98;
  String local_78;
  String local_58;
  String local_38;
  
  FilterInstancer::FilterInstancer(&this->super_FilterInstancer);
  (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)&PTR__FilterInstancer_00398820
  ;
  (this->ids).value = Invalid;
  if (value_type == Angle) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"value",&local_99);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,default_value,&local_9a);
    pPVar2 = EffectSpecification::RegisterProperty
                       (&(this->super_FilterInstancer).super_EffectSpecification,&local_78,&local_98
                       );
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"angle",&local_9b);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
    pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
    PVar1 = PropertyDefinition::GetId(pPVar2);
  }
  else {
    if (value_type != NumberPercent) goto LAB_002a684f;
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"value",&local_99);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,default_value,&local_9a);
    pPVar2 = EffectSpecification::RegisterProperty
                       (&(this->super_FilterInstancer).super_EffectSpecification,&local_78,&local_98
                       );
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"number_percent",&local_9b);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
    pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
    PVar1 = PropertyDefinition::GetId(pPVar2);
  }
  (this->ids).value = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
LAB_002a684f:
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"filter",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"value",(allocator<char> *)&local_58);
  EffectSpecification::RegisterShorthand
            (&(this->super_FilterInstancer).super_EffectSpecification,&local_78,&local_98,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

FilterBasicInstancer::FilterBasicInstancer(ValueType value_type, const char* default_value)
{
	switch (value_type)
	{
	case ValueType::NumberPercent: ids.value = RegisterProperty("value", default_value).AddParser("number_percent").GetId(); break;
	case ValueType::Angle: ids.value = RegisterProperty("value", default_value).AddParser("angle").GetId(); break;
	}

	RegisterShorthand("filter", "value", ShorthandType::FallThrough);
}